

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeaderBase.cpp
# Opt level: O2

ssize_t __thiscall
HttpHeaderBase::send(HttpHeaderBase *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ssize_t sVar1;
  size_type sVar2;
  undefined4 in_register_00000034;
  
  sVar2 = (this->mHeaderStr)._M_string_length;
  if (sVar2 == 0) {
    buildHeader(this);
    sVar2 = (this->mHeaderStr)._M_string_length;
  }
  sVar1 = (**(code **)(*(long *)CONCAT44(in_register_00000034,__fd) + 0x18))
                    ((long *)CONCAT44(in_register_00000034,__fd),(this->mHeaderStr)._M_dataplus._M_p
                     ,sVar2);
  return sVar1;
}

Assistant:

int HttpHeaderBase::send(IReaderWriter *writer) const
{
	TRACE_BEGIN(LOG_LVL_INFO);
	
	if (mHeaderStr.empty())
	{
		buildHeader();
	}
	
	LOG("Writing header of length %d", mHeaderStr.size());
	
	return writer->write(mHeaderStr.c_str(), mHeaderStr.size());
}